

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapOneofField
          (GeneratedMessageReflection *this,Message *message1,Message *message2,
          OneofDescriptor *oneof_descriptor)

{
  FieldDescriptor *field;
  Message *message;
  CppType CVar1;
  long *plVar2;
  uint *puVar3;
  unsigned_long *puVar4;
  float *pfVar5;
  double *pdVar6;
  bool *pbVar7;
  int *piVar8;
  LogMessage *pLVar9;
  Message *sub_message;
  LogFinisher local_1a9;
  LogMessage local_1a8;
  LogFinisher local_169;
  LogMessage local_168;
  string local_130;
  FieldDescriptor *local_110;
  FieldDescriptor *field2;
  LogMessage local_100;
  string local_c8;
  FieldDescriptor *local_98;
  FieldDescriptor *field1;
  string temp_string;
  Message *temp_message;
  int temp_int;
  bool temp_bool;
  double temp_double;
  unsigned_long uStack_50;
  float temp_float;
  uint64 temp_uint64;
  long lStack_40;
  uint32 temp_uint32;
  int64 temp_int64;
  uint32 local_30;
  int32 temp_int32;
  uint32 oneof_case2;
  uint32 oneof_case1;
  OneofDescriptor *oneof_descriptor_local;
  Message *message2_local;
  Message *message1_local;
  GeneratedMessageReflection *this_local;
  
  _oneof_case2 = oneof_descriptor;
  oneof_descriptor_local = (OneofDescriptor *)message2;
  message2_local = message1;
  message1_local = (Message *)this;
  temp_int32 = GetOneofCase(this,message1,oneof_descriptor);
  local_30 = GetOneofCase(this,(Message *)oneof_descriptor_local,_oneof_case2);
  temp_string.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&field1);
  local_98 = (FieldDescriptor *)0x0;
  if (temp_int32 != 0) {
    local_98 = Descriptor::FindFieldByNumber(this->descriptor_,temp_int32);
    CVar1 = FieldDescriptor::cpp_type(local_98);
    switch(CVar1) {
    case CPPTYPE_INT32:
      piVar8 = GetField<int>(this,message2_local,local_98);
      temp_int64._4_4_ = *piVar8;
      break;
    case CPPTYPE_INT64:
      plVar2 = GetField<long>(this,message2_local,local_98);
      lStack_40 = *plVar2;
      break;
    case CPPTYPE_UINT32:
      puVar3 = GetField<unsigned_int>(this,message2_local,local_98);
      temp_uint64._4_4_ = *puVar3;
      break;
    case CPPTYPE_UINT64:
      puVar4 = GetField<unsigned_long>(this,message2_local,local_98);
      uStack_50 = *puVar4;
      break;
    case CPPTYPE_DOUBLE:
      pdVar6 = GetField<double>(this,message2_local,local_98);
      _temp_int = *pdVar6;
      break;
    case CPPTYPE_FLOAT:
      pfVar5 = GetField<float>(this,message2_local,local_98);
      temp_double._4_4_ = *pfVar5;
      break;
    case CPPTYPE_BOOL:
      pbVar7 = GetField<bool>(this,message2_local,local_98);
      temp_message._7_1_ = *pbVar7 & 1;
      break;
    case CPPTYPE_ENUM:
      piVar8 = GetField<int>(this,message2_local,local_98);
      temp_message._0_4_ = *piVar8;
      break;
    case CPPTYPE_STRING:
      GetString_abi_cxx11_(&local_c8,this,message2_local,local_98);
      std::__cxx11::string::operator=((string *)&field1,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      break;
    case CPPTYPE_MESSAGE:
      temp_string.field_2._8_8_ = ReleaseMessage(this,message2_local,local_98,(MessageFactory *)0x0)
      ;
      break;
    default:
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x204);
      pLVar9 = LogMessage::operator<<(&local_100,"Unimplemented type: ");
      CVar1 = FieldDescriptor::cpp_type(local_98);
      pLVar9 = LogMessage::operator<<(pLVar9,CVar1);
      LogFinisher::operator=((LogFinisher *)((long)&field2 + 7),pLVar9);
      LogMessage::~LogMessage(&local_100);
    }
  }
  if (local_30 == 0) {
    ClearOneof(this,message2_local,_oneof_case2);
  }
  else {
    local_110 = Descriptor::FindFieldByNumber(this->descriptor_,local_30);
    CVar1 = FieldDescriptor::cpp_type(local_110);
    message = message2_local;
    field = local_110;
    switch(CVar1) {
    case CPPTYPE_INT32:
      piVar8 = GetField<int>(this,(Message *)oneof_descriptor_local,local_110);
      SetField<int>(this,message,field,piVar8);
      break;
    case CPPTYPE_INT64:
      plVar2 = GetField<long>(this,(Message *)oneof_descriptor_local,local_110);
      SetField<long>(this,message,field,plVar2);
      break;
    case CPPTYPE_UINT32:
      puVar3 = GetField<unsigned_int>(this,(Message *)oneof_descriptor_local,local_110);
      SetField<unsigned_int>(this,message,field,puVar3);
      break;
    case CPPTYPE_UINT64:
      puVar4 = GetField<unsigned_long>(this,(Message *)oneof_descriptor_local,local_110);
      SetField<unsigned_long>(this,message,field,puVar4);
      break;
    case CPPTYPE_DOUBLE:
      pdVar6 = GetField<double>(this,(Message *)oneof_descriptor_local,local_110);
      SetField<double>(this,message,field,pdVar6);
      break;
    case CPPTYPE_FLOAT:
      pfVar5 = GetField<float>(this,(Message *)oneof_descriptor_local,local_110);
      SetField<float>(this,message,field,pfVar5);
      break;
    case CPPTYPE_BOOL:
      pbVar7 = GetField<bool>(this,(Message *)oneof_descriptor_local,local_110);
      SetField<bool>(this,message,field,pbVar7);
      break;
    case CPPTYPE_ENUM:
      piVar8 = GetField<int>(this,(Message *)oneof_descriptor_local,local_110);
      SetField<int>(this,message,field,piVar8);
      break;
    case CPPTYPE_STRING:
      GetString_abi_cxx11_(&local_130,this,(Message *)oneof_descriptor_local,local_110);
      SetString(this,message,field,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      break;
    case CPPTYPE_MESSAGE:
      sub_message = ReleaseMessage(this,(Message *)oneof_descriptor_local,local_110,
                                   (MessageFactory *)0x0);
      SetAllocatedMessage(this,message,sub_message,local_110);
      break;
    default:
      LogMessage::LogMessage
                (&local_168,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x226);
      pLVar9 = LogMessage::operator<<(&local_168,"Unimplemented type: ");
      CVar1 = FieldDescriptor::cpp_type(local_110);
      pLVar9 = LogMessage::operator<<(pLVar9,CVar1);
      LogFinisher::operator=(&local_169,pLVar9);
      LogMessage::~LogMessage(&local_168);
    }
  }
  if (temp_int32 == 0) {
    ClearOneof(this,(Message *)oneof_descriptor_local,_oneof_case2);
  }
  else {
    CVar1 = FieldDescriptor::cpp_type(local_98);
    switch(CVar1) {
    case CPPTYPE_INT32:
      SetField<int>(this,(Message *)oneof_descriptor_local,local_98,(int *)((long)&temp_int64 + 4));
      break;
    case CPPTYPE_INT64:
      SetField<long>(this,(Message *)oneof_descriptor_local,local_98,&stack0xffffffffffffffc0);
      break;
    case CPPTYPE_UINT32:
      SetField<unsigned_int>
                (this,(Message *)oneof_descriptor_local,local_98,(uint *)((long)&temp_uint64 + 4));
      break;
    case CPPTYPE_UINT64:
      SetField<unsigned_long>
                (this,(Message *)oneof_descriptor_local,local_98,&stack0xffffffffffffffb0);
      break;
    case CPPTYPE_DOUBLE:
      SetField<double>(this,(Message *)oneof_descriptor_local,local_98,(double *)&temp_int);
      break;
    case CPPTYPE_FLOAT:
      SetField<float>(this,(Message *)oneof_descriptor_local,local_98,
                      (float *)((long)&temp_double + 4));
      break;
    case CPPTYPE_BOOL:
      SetField<bool>(this,(Message *)oneof_descriptor_local,local_98,
                     (bool *)((long)&temp_message + 7));
      break;
    case CPPTYPE_ENUM:
      SetField<int>(this,(Message *)oneof_descriptor_local,local_98,(int *)&temp_message);
      break;
    case CPPTYPE_STRING:
      SetString(this,(Message *)oneof_descriptor_local,local_98,(string *)&field1);
      break;
    case CPPTYPE_MESSAGE:
      SetAllocatedMessage(this,(Message *)oneof_descriptor_local,
                          (Message *)temp_string.field_2._8_8_,local_98);
      break;
    default:
      LogMessage::LogMessage
                (&local_1a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x246);
      pLVar9 = LogMessage::operator<<(&local_1a8,"Unimplemented type: ");
      CVar1 = FieldDescriptor::cpp_type(local_98);
      pLVar9 = LogMessage::operator<<(pLVar9,CVar1);
      LogFinisher::operator=(&local_1a9,pLVar9);
      LogMessage::~LogMessage(&local_1a8);
    }
  }
  std::__cxx11::string::~string((string *)&field1);
  return;
}

Assistant:

void GeneratedMessageReflection::SwapOneofField(
    Message* message1,
    Message* message2,
    const OneofDescriptor* oneof_descriptor) const {
  uint32 oneof_case1 = GetOneofCase(*message1, oneof_descriptor);
  uint32 oneof_case2 = GetOneofCase(*message2, oneof_descriptor);

  int32 temp_int32;
  int64 temp_int64;
  uint32 temp_uint32;
  uint64 temp_uint64;
  float temp_float;
  double temp_double;
  bool temp_bool;
  int temp_int;
  Message* temp_message = NULL;
  string temp_string;

  // Stores message1's oneof field to a temp variable.
  const FieldDescriptor* field1 = NULL;
  if (oneof_case1 > 0) {
    field1 = descriptor_->FindFieldByNumber(oneof_case1);
    //oneof_descriptor->field(oneof_case1);
    switch (field1->cpp_type()) {
#define GET_TEMP_VALUE(CPPTYPE, TYPE)                                   \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        temp_##TYPE = GetField<TYPE>(*message1, field1);                \
        break;

      GET_TEMP_VALUE(INT32 , int32 );
      GET_TEMP_VALUE(INT64 , int64 );
      GET_TEMP_VALUE(UINT32, uint32);
      GET_TEMP_VALUE(UINT64, uint64);
      GET_TEMP_VALUE(FLOAT , float );
      GET_TEMP_VALUE(DOUBLE, double);
      GET_TEMP_VALUE(BOOL  , bool  );
      GET_TEMP_VALUE(ENUM  , int   );
#undef GET_TEMP_VALUE
      case FieldDescriptor::CPPTYPE_MESSAGE:
        temp_message = ReleaseMessage(message1, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        temp_string = GetString(*message1, field1);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  }

  // Sets message1's oneof field from the message2's oneof field.
  if (oneof_case2 > 0) {
    const FieldDescriptor* field2 =
        descriptor_->FindFieldByNumber(oneof_case2);
    switch (field2->cpp_type()) {
#define SET_ONEOF_VALUE1(CPPTYPE, TYPE)                                 \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        SetField<TYPE>(message1, field2, GetField<TYPE>(*message2, field2)); \
        break;

      SET_ONEOF_VALUE1(INT32 , int32 );
      SET_ONEOF_VALUE1(INT64 , int64 );
      SET_ONEOF_VALUE1(UINT32, uint32);
      SET_ONEOF_VALUE1(UINT64, uint64);
      SET_ONEOF_VALUE1(FLOAT , float );
      SET_ONEOF_VALUE1(DOUBLE, double);
      SET_ONEOF_VALUE1(BOOL  , bool  );
      SET_ONEOF_VALUE1(ENUM  , int   );
#undef SET_ONEOF_VALUE1
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message1,
                            ReleaseMessage(message2, field2),
                            field2);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message1, field2, GetString(*message2, field2));
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field2->cpp_type();
    }
  } else {
    ClearOneof(message1, oneof_descriptor);
  }

  // Sets message2's oneof field from the temp variable.
  if (oneof_case1 > 0) {
    switch (field1->cpp_type()) {
#define SET_ONEOF_VALUE2(CPPTYPE, TYPE)                                 \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        SetField<TYPE>(message2, field1, temp_##TYPE);                  \
        break;

      SET_ONEOF_VALUE2(INT32 , int32 );
      SET_ONEOF_VALUE2(INT64 , int64 );
      SET_ONEOF_VALUE2(UINT32, uint32);
      SET_ONEOF_VALUE2(UINT64, uint64);
      SET_ONEOF_VALUE2(FLOAT , float );
      SET_ONEOF_VALUE2(DOUBLE, double);
      SET_ONEOF_VALUE2(BOOL  , bool  );
      SET_ONEOF_VALUE2(ENUM  , int   );
#undef SET_ONEOF_VALUE2
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message2, temp_message, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message2, field1, temp_string);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  } else {
    ClearOneof(message2, oneof_descriptor);
  }
}